

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.cc
# Opt level: O3

void __thiscall
Zip::Zip(Zip *this,
        unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
        *is)

{
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> _Var1;
  ostream *poVar2;
  runtime_error *prVar3;
  size_t len;
  pointer *__ptr;
  int *in_R9;
  stringstream ss;
  undefined4 local_1d8 [8];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  (this->is_)._M_t.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (is->_M_t).
       super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  (is->_M_t).
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (basic_istream<char,_std::char_traits<char>_> *)0x0;
  (this->fileName_)._M_dataplus._M_p = (pointer)&(this->fileName_).field_2;
  (this->fileName_)._M_string_length = 0;
  (this->fileName_).field_2._M_local_buf[0] = '\0';
  (this->extraField_)._M_dataplus._M_p = (pointer)&(this->extraField_).field_2;
  (this->extraField_)._M_string_length = 0;
  (this->extraField_).field_2._M_local_buf[0] = '\0';
  std::istream::seekg((long)(this->is_)._M_t.
                            super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl,0xffffffea);
  std::istream::read((char *)(this->is_)._M_t.
                             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,(long)&this->eocd_);
  _Var1._M_head_impl =
       (this->is_)._M_t.
       super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  if (*(int *)((long)&(_Var1._M_head_impl)->field_0x20 +
              *(long *)((long)(_Var1._M_head_impl)->_vptr_basic_istream + -0x18)) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8[0] = 0x3a;
    util::str<char[35],char[88],char[2],int>
              ((string *)local_1b8,(util *)"Assertion `is_->good()` failed at ",
               (char (*) [35])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lib/zip.cc"
               ,(char (*) [88])0x1afe61,(char (*) [2])local_1d8,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  anon_unknown.dwarf_308140::checkSignature
            (0x6054b50,(uint8_t *)(ulong)*(uint *)(this->eocd_).signature);
  if ((this->eocd_).numEntries != 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x10),"eocd_.numEntries: ",0x12);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," != 1",5);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)local_1d8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::seekg((this->is_)._M_t.
                      super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(this->eocd_).centralDirectoryOffset,0);
  std::istream::read((char *)(this->is_)._M_t.
                             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,(long)&this->cdfh_);
  _Var1._M_head_impl =
       (this->is_)._M_t.
       super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  if (*(int *)((long)&(_Var1._M_head_impl)->field_0x20 +
              *(long *)((long)(_Var1._M_head_impl)->_vptr_basic_istream + -0x18)) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8[0] = 0x47;
    util::str<char[35],char[88],char[2],int>
              ((string *)local_1b8,(util *)"Assertion `is_->good()` failed at ",
               (char (*) [35])
               "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lib/zip.cc"
               ,(char (*) [88])0x1afe61,(char (*) [2])local_1d8,in_R9);
    std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  anon_unknown.dwarf_308140::checkSignature
            (0x2014b50,(uint8_t *)(ulong)*(uint *)(this->cdfh_).signature);
  std::istream::seekg((this->is_)._M_t.
                      super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                      ._M_head_impl,(this->cdfh_).relativeOffsetOflocalHeader,0);
  std::istream::read((char *)(this->is_)._M_t.
                             super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl,(long)&this->lfh_);
  _Var1._M_head_impl =
       (this->is_)._M_t.
       super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
       .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
       _M_head_impl;
  len = *(size_t *)((long)(_Var1._M_head_impl)->_vptr_basic_istream + -0x18);
  if (*(int *)((long)&(_Var1._M_head_impl)->field_0x20 + len) == 0) {
    anon_unknown.dwarf_308140::checkSignature
              (0x4034b50,(uint8_t *)(ulong)*(uint *)(this->lfh_).signature);
    (anonymous_namespace)::loadString_abi_cxx11_
              ((string *)local_1b8,(_anonymous_namespace_ *)this,
               (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)(ulong)(this->lfh_).fileNameLength,len);
    std::__cxx11::string::operator=((string *)&this->fileName_,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    (anonymous_namespace)::loadString_abi_cxx11_
              ((string *)local_1b8,(_anonymous_namespace_ *)this,
               (unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                *)(ulong)(this->lfh_).extraFieldLength,len);
    std::__cxx11::string::operator=((string *)&this->extraField_,(string *)local_1b8);
    if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1d8[0] = 0x4d;
  util::str<char[35],char[88],char[2],int>
            ((string *)local_1b8,(util *)"Assertion `is_->good()` failed at ",
             (char (*) [35])
             "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/lib/zip.cc"
             ,(char (*) [88])0x1afe61,(char (*) [2])local_1d8,in_R9);
  std::runtime_error::runtime_error(prVar3,(string *)local_1b8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Zip::Zip(std::unique_ptr<std::istream> is)
  : is_(std::move(is)) {
  // Load EOCD record
  is_->seekg(-(std::streampos) sizeof(eocd_), is_->end);
  is_->read((char*) &eocd_, sizeof(eocd_));
  ASSERT(is_->good());
  checkSignature(0x06054b50, eocd_.signature);

  // Expect only a single central directory header
  if (eocd_.numEntries != 1) {
    std::stringstream ss;
    ss << "eocd_.numEntries: " << eocd_.numEntries << " != 1";
    throw std::runtime_error(ss.str());
  }

  // Load central directory file header
  is_->seekg(eocd_.centralDirectoryOffset);
  is_->read((char*) &cdfh_, sizeof(cdfh_));
  ASSERT(is_->good());
  checkSignature(0x02014b50, cdfh_.signature);

  // Load local file header
  is_->seekg(cdfh_.relativeOffsetOflocalHeader);
  is_->read((char*) &lfh_, sizeof(lfh_));
  ASSERT(is_->good());
  checkSignature(0x04034b50, lfh_.signature);

  // Load filename
  fileName_ = loadString(is_, lfh_.fileNameLength);
  extraField_ = loadString(is_, lfh_.extraFieldLength);
}